

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void __thiscall CVmObjBigNum::wp8(CVmObjBigNum *this,char *buf,int *ov)

{
  wp8abs(this,buf,ov);
  if (((this->super_CVmObject).ext_[4] & 1U) == 0) {
    return;
  }
  *ov = 1;
  twos_complement_p8((uchar *)buf);
  return;
}

Assistant:

void CVmObjBigNum::wp8(char *buf, int &ov) const
{
    /* generate the absolute value */
    wp8abs(buf, ov);

    /* 
     *   if the value is negative, we can't represent it as unsigned; take
     *   the two's complement in case they want the truncated version of the
     *   value, and set the overflow flag 
     */
    if (get_neg(ext_))
    {
        ov = TRUE;
        twos_complement_p8((unsigned char *)buf);
    }
}